

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O1

double __thiscall
Trainer::Trainer<Kuhn::Game>::chanceSamplingCFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex,double pi,double po)

{
  uint8_t *__param;
  long lVar1;
  bool bVar2;
  uint actionNum;
  int iVar3;
  result_type action;
  mapped_type *ppNVar4;
  mapped_type this_00;
  double *pdVar5;
  ulong uVar6;
  iterator iVar7;
  undefined8 uVar8;
  void *unaff_R12;
  ulong uVar9;
  double dVar10;
  double dVar11;
  code *pcStack_140;
  double dStack_138;
  undefined1 local_130 [8];
  Game game_cp;
  discrete_distribution<int> dist;
  string infoSet;
  double local_40;
  
  this->mNodeTouchedCnt = this->mNodeTouchedCnt + 1;
  pcStack_140 = (code *)0x113424;
  bVar2 = Kuhn::Game::done(game);
  if (bVar2) {
    dVar10 = Kuhn::Game::payoff(game,playerIndex);
    return dVar10;
  }
  pcStack_140 = (code *)0x113450;
  Kuhn::Game::infoSetStr_abi_cxx11_
            ((string *)
             &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,game);
  pcStack_140 = (code *)0x113458;
  actionNum = Kuhn::Game::actionNum(game);
  pcStack_140 = (code *)0x113467;
  iVar3 = Kuhn::Game::currentPlayer(game);
  if (this->mUpdate[iVar3] == false) {
    pcStack_140 = (code *)0x11359e;
    Kuhn::Game::Game((Game *)local_130,game);
    pcStack_140 = (code *)0x1135b5;
    iVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this->mFixedStrategies[iVar3]._M_h,
                   (key_type *)
                   &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
        ._M_cur == (__node_type *)0x0) {
      pcStack_140 = (code *)0x1136ff;
      uVar8 = std::__throw_out_of_range("_Map_base::at");
      pcStack_140 = (code *)0x11370f;
      operator_delete(unaff_R12,0x30);
      if (dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)&infoSet._M_string_length) {
        pcStack_140 = (code *)0x113756;
        operator_delete(dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                        infoSet._M_string_length + 1);
      }
      pcStack_140 = externalSamplingCFR;
      _Unwind_Resume(uVar8);
    }
    pcStack_140 = (code *)0x1135c7;
    pdVar5 = Node::averageStrategy
                       (*(Node **)((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
                                         ._M_cur + 0x28));
    pcStack_140 = (code *)0x1135de;
    std::discrete_distribution<int>::param_type::param_type<double_const*>
              ((param_type *)(game_cp.mInfoSets[1] + 9),pdVar5,pdVar5 + (int)actionNum);
    __param = game_cp.mInfoSets[1] + 9;
    pcStack_140 = (code *)0x1135f0;
    action = std::discrete_distribution<int>::operator()
                       ((discrete_distribution<int> *)__param,&this->mEngine,(param_type *)__param);
    pcStack_140 = (code *)0x1135fe;
    Kuhn::Game::step((Game *)local_130,action);
    pcStack_140 = (code *)0x11361a;
    local_40 = chanceSamplingCFR(this,(Game *)local_130,playerIndex,pi,po);
    if (dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      pcStack_140 = (code *)0x11363a;
      operator_delete(dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)dist._M_param._M_prob.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    }
    if (game_cp._88_8_ != 0) {
      pcStack_140 = (code *)0x113655;
      operator_delete((void *)game_cp._88_8_,
                      (long)dist._M_param._M_prob.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - game_cp._88_8_);
    }
  }
  else {
    pcStack_140 = (code *)0x113495;
    ppNVar4 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->mNodeMap,
                           (key_type *)
                           &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = *ppNVar4;
    if (this_00 == (mapped_type)0x0) {
      pcStack_140 = (code *)0x1134a7;
      this_00 = (mapped_type)operator_new(0x30);
      pcStack_140 = (code *)0x1134b5;
      Node::Node(this_00,actionNum);
      pcStack_140 = (code *)0x1134c4;
      ppNVar4 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->mNodeMap,
                             (key_type *)
                             &dist._M_param._M_cp.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      *ppNVar4 = this_00;
    }
    pcStack_140 = (code *)0x1134d6;
    infoSet.field_2._8_8_ = this;
    pdVar5 = Node::strategy(this_00);
    uVar6 = (ulong)actionNum;
    lVar1 = -(uVar6 * 8 + 0xf & 0xfffffffffffffff0);
    if ((int)actionNum < 1) {
      local_40 = 0.0;
    }
    else {
      local_40 = 0.0;
      uVar9 = 0;
      do {
        *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x113526;
        Kuhn::Game::Game((Game *)local_130,game);
        *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x113531;
        Kuhn::Game::step((Game *)local_130,(int)uVar9);
        uVar8 = infoSet.field_2._8_8_;
        if (iVar3 == playerIndex) {
          dVar10 = pdVar5[uVar9] * pi;
          dVar11 = po;
        }
        else {
          dVar10 = pi;
          dVar11 = pdVar5[uVar9] * po;
        }
        *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x113565;
        dVar10 = chanceSamplingCFR((Trainer<Kuhn::Game> *)uVar8,(Game *)local_130,playerIndex,dVar10
                                   ,dVar11);
        *(double *)((long)&dStack_138 + uVar9 * 8 + lVar1 + -0x138 + 0x138) = dVar10;
        local_40 = local_40 + dVar10 * pdVar5[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
    }
    if (iVar3 == playerIndex) {
      if (0 < (int)actionNum) {
        uVar9 = 0;
        do {
          dVar10 = *(double *)((long)&dStack_138 + uVar9 * 8 + lVar1 + -0x138 + 0x138);
          *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x113682;
          dVar11 = Node::regretSum(this_00,(int)uVar9);
          *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x1136a3;
          Node::regretSum(this_00,(int)uVar9,(dVar10 - local_40) * po + dVar11);
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x1136bc;
      Node::strategySum(this_00,pdVar5,pi);
    }
  }
  if (dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)&infoSet._M_string_length) {
    pcStack_140 = (code *)0x1136df;
    operator_delete(dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,infoSet._M_string_length + 1);
  }
  return local_40;
}

Assistant:

double Trainer<T>::chanceSamplingCFR(const T &game, const int playerIndex, const double pi, const double po) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return game.payoff(playerIndex);
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // treat static player as chance node
    const int actionNum = game.actionNum();
    const int player = game.currentPlayer();
    if (!mUpdate[player]) {
        auto game_cp(game);
        auto strategy = mFixedStrategies[player].at(infoSet)->averageStrategy();
        std::discrete_distribution<int> dist(strategy, strategy + actionNum);
        game_cp.step(dist(mEngine));
        return chanceSamplingCFR(game_cp, playerIndex, pi, po);
    }

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    const double *strategy = node->strategy();

    // for each action, recursively call cfr with additional history and probability
    double utils[actionNum];
    double nodeUtil = 0;
    for (int a = 0; a < actionNum; ++a) {
        auto game_cp(game);
        game_cp.step(a);
        if (player == playerIndex) {
            utils[a] = chanceSamplingCFR(game_cp, playerIndex, pi * strategy[a], po);
        } else {
            utils[a] = chanceSamplingCFR(game_cp, playerIndex, pi, po * strategy[a]);
        }
        nodeUtil += strategy[a] * utils[a];
    }

    if (player == playerIndex) {
        // for each action, compute and accumulate counterfactual regret
        for (int a = 0; a < actionNum; ++a) {
            const double regret = utils[a] - nodeUtil;
            const double regretSum = node->regretSum(a) + po * regret;
            node->regretSum(a, regretSum);
        }
        // update average strategy across all training iterations
        node->strategySum(strategy, pi);
    }

    return nodeUtil;
}